

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  Fault node;
  PromiseFulfiller<void> *pPVar3;
  int iVar4;
  SocketAddress *pSVar5;
  iovec *piVar6;
  long lVar7;
  void *pvVar8;
  size_t sVar9;
  long *plVar10;
  PromiseFulfiller<void> *elementCount;
  iovec *ptrCopy_1;
  byte *pbVar11;
  iovec *piVar12;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  long lVar13;
  Exception *this_00;
  PromiseFulfiller<void> *elementCount_00;
  Fault f;
  Array<unsigned_char> extra;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  undefined1 local_228 [8];
  Fault local_220;
  Disposer *local_218;
  PromiseFulfiller<void> *local_210;
  Disposer *local_208;
  iovec *local_200;
  Disposer *local_1f8;
  PromiseFulfiller<void> *local_1f0;
  Disposer *local_1e8;
  PromiseFulfiller<void> *pPStack_1e0;
  undefined8 *local_1d8;
  PromiseArena *local_1c8;
  _func_int **local_1c0;
  NetworkAddressImpl *local_1b8;
  PromiseFulfiller<void> *local_1b0;
  iovec *local_1a8;
  PromiseFulfiller<void> *pPStack_1a0;
  undefined8 *local_198;
  DatagramPortImpl *local_190;
  SourceLocation local_188;
  msghdr local_170;
  iovec local_138 [16];
  
  local_1b8 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  local_1f0 = (PromiseFulfiller<void> *)CONCAT44(in_register_00000034,__fd);
  local_170.msg_controllen = 0;
  local_170.msg_flags = 0;
  local_170._52_4_ = 0;
  local_170.msg_iovlen = 0;
  local_170.msg_control = (void *)0x0;
  local_170.msg_namelen = 0;
  local_170._12_4_ = 0;
  local_170.msg_iov = (iovec *)0x0;
  pSVar5 = NetworkAddressImpl::chooseOneAddress(local_1b8);
  local_170.msg_name = &pSVar5->addr;
  local_170.msg_namelen = pSVar5->addrlen;
  elementCount = (PromiseFulfiller<void> *)0x400;
  if (__n < 0x400) {
    elementCount = (PromiseFulfiller<void> *)__n;
  }
  local_1c0 = (_func_int **)__n;
  if (__n < 0x11) {
    local_1a8 = (iovec *)0x0;
    pPStack_1a0 = (PromiseFulfiller<void> *)0x0;
    local_198 = (undefined8 *)0x0;
    if (__n == 0) {
      local_1e8 = (Disposer *)0x0;
      pPStack_1e0 = (PromiseFulfiller<void> *)0x0;
      local_1d8 = (undefined8 *)0x0;
      piVar6 = local_138;
      local_208 = (Disposer *)0x0;
      local_210 = (PromiseFulfiller<void> *)0x0;
      piVar12 = (iovec *)0x0;
      local_218 = (Disposer *)0x0;
      elementCount_00 = (PromiseFulfiller<void> *)0x0;
      local_1f8 = (Disposer *)0x0;
      goto LAB_00494dab;
    }
    piVar6 = local_138;
    local_208 = (Disposer *)0x0;
  }
  else {
    piVar6 = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x10,(size_t)elementCount,(size_t)elementCount,
                                 (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_208 = (Disposer *)&kj::_::HeapArrayDisposer::instance;
    local_198 = &kj::_::HeapArrayDisposer::instance;
    local_1a8 = piVar6;
    pPStack_1a0 = elementCount;
  }
  lVar7 = 8;
  sVar9 = __n;
  do {
    *(undefined8 *)((long)piVar6 + lVar7 + -8) = *(undefined8 *)((long)__buf + lVar7 + -8);
    *(undefined8 *)((long)&piVar6->iov_base + lVar7) = *(undefined8 *)((long)__buf + lVar7);
    lVar7 = lVar7 + 0x10;
    sVar9 = sVar9 - 1;
  } while (sVar9 != 0);
  local_1e8 = (Disposer *)0x0;
  pPStack_1e0 = (PromiseFulfiller<void> *)0x0;
  local_1d8 = (undefined8 *)0x0;
  local_210 = pPStack_1a0;
  local_1b0 = elementCount;
  if (__n < 0x401) {
    local_218 = (Disposer *)0x0;
    elementCount_00 = (PromiseFulfiller<void> *)0x0;
    local_1f8 = (Disposer *)0x0;
    piVar12 = local_1a8;
  }
  else {
    lVar7 = __n - 0x3ff;
    plVar10 = (long *)((long)__buf + 0x3ff8);
    elementCount_00 = (PromiseFulfiller<void> *)0x0;
    do {
      elementCount_00 =
           (PromiseFulfiller<void> *)
           ((long)&(elementCount_00->super_PromiseRejector)._vptr_PromiseRejector + *plVar10);
      plVar10 = plVar10 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    local_200 = local_1a8;
    local_1c8 = (PromiseArena *)__buf;
    local_190 = this;
    local_1f8 = (Disposer *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (1,(size_t)elementCount_00,(size_t)elementCount_00,
                           (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_218 = (Disposer *)&kj::_::HeapArrayDisposer::instance;
    local_1d8 = &kj::_::HeapArrayDisposer::instance;
    lVar13 = __n - 0x3ff;
    pbVar11 = local_1c8[0xf].bytes + 0x3f8;
    lVar7 = 0;
    local_1e8 = local_1f8;
    pPStack_1e0 = elementCount_00;
    do {
      memcpy((void *)((long)&local_1f8->_vptr_Disposer + lVar7),*(void **)(pbVar11 + -8),
             *(size_t *)pbVar11);
      lVar7 = lVar7 + *(size_t *)pbVar11;
      pbVar11 = pbVar11 + 0x10;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    piVar6[(long)((long)&local_1b0[-1].super_PromiseRejector._vptr_PromiseRejector + 7)].iov_base =
         local_1f8;
    piVar6[(long)((long)&local_1b0[-1].super_PromiseRejector._vptr_PromiseRejector + 7)].iov_len =
         (size_t)elementCount_00;
    elementCount = local_1b0;
    piVar12 = local_200;
    __buf = local_1c8;
    this = local_190;
  }
LAB_00494dab:
  pPVar3 = local_1f0;
  local_170.msg_iov = piVar6;
  local_170.msg_iovlen = (size_t)elementCount;
  do {
    local_188.fileName =
         (char *)sendmsg(*(int *)&pPVar3[1].super_PromiseRejector._vptr_PromiseRejector,&local_170,0
                        );
    if (-1 < (long)local_188.fileName) {
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)this,(unsigned_long *)&local_188);
      goto LAB_00494f6e;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_220.exception = (Exception *)0x0;
    local_188.fileName = (char *)0x0;
    local_188.function = (char *)0x0;
    kj::_::Debug::Fault::init
              (&local_220,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_220);
  }
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_228);
  auVar2 = local_228;
  pPVar1 = (PromiseArena *)
           ((SleepHooks *)&((PromiseArenaMember *)local_228)->arena)->_vptr_SleepHooks;
  local_200 = piVar12;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_228 - (long)pPVar1) < 0x40) {
    pvVar8 = operator_new(0x400);
    this_00 = (Exception *)((long)pvVar8 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_228,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1828:48)>
               ::anon_class_32_3_8270f0b6_for_func::operator());
    *(undefined ***)((long)pvVar8 + 0x3c0) = &PTR_destroy_006e25c0;
    *(PromiseFulfiller<void> **)((long)pvVar8 + 0x3e0) = local_1f0;
    *(void **)((long)pvVar8 + 1000) = __buf;
    *(_func_int ***)((long)pvVar8 + 0x3f0) = local_1c0;
    *(NetworkAddressImpl **)((long)pvVar8 + 0x3f8) = local_1b8;
    *(void **)((long)pvVar8 + 0x3c8) = pvVar8;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_228)->arena)->_vptr_SleepHooks = (_func_int **)0x0;
    this_00 = (Exception *)((long)local_228 + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_228,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1828:48)>
               ::anon_class_32_3_8270f0b6_for_func::operator());
    ((PromiseArenaMember *)((long)auVar2 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006e25c0;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)local_1f0;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->arena = (PromiseArena *)__buf;
    ((PromiseArenaMember *)((long)auVar2 + -0x10))->_vptr_PromiseArenaMember = local_1c0;
    ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = (PromiseArena *)local_1b8;
    ((PromiseArenaMember *)((long)auVar2 + -0x40))->arena = pPVar1;
  }
  local_188.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_188.function = "then";
  local_188.lineNumber = 0x58b;
  local_188.columnNumber = 0x4c;
  local_220.exception = this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,(OwnPromiseNode *)&local_220,&local_188);
  node.exception = local_220.exception;
  if (local_220.exception != (Exception *)0x0) {
    local_220.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
  }
  piVar12 = local_200;
  auVar2 = local_228;
  if (local_228 != (undefined1  [8])0x0) {
    local_228 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
LAB_00494f6e:
  if (local_1f8 != (Disposer *)0x0) {
    local_1e8 = (Disposer *)0x0;
    pPStack_1e0 = (PromiseFulfiller<void> *)0x0;
    (**local_218->_vptr_Disposer)(local_218,local_1f8,1,elementCount_00,elementCount_00,0);
  }
  if (piVar12 != (iovec *)0x0) {
    local_1a8 = (iovec *)0x0;
    pPStack_1a0 = (PromiseFulfiller<void> *)0x0;
    (**local_208->_vptr_Disposer)(local_208,piVar12,0x10,local_210,local_210,0);
  }
  return (ssize_t)this;
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const ArrayPtr<const byte>> pieces, NetworkAddress& destination) {
  struct msghdr msg;
  memset(&msg, 0, sizeof(msg));

  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();
  msg.msg_name = const_cast<void*>(implicitCast<const void*>(addr.getRaw()));
  msg.msg_namelen = addr.getRawSize();

  const size_t iovmax = kj::miniposix::iovMax();
  KJ_STACK_ARRAY(struct iovec, iov, kj::min(pieces.size(), iovmax), 16, 64);

  for (size_t i: kj::indices(pieces)) {
    iov[i].iov_base = const_cast<void*>(implicitCast<const void*>(pieces[i].begin()));
    iov[i].iov_len = pieces[i].size();
  }

  Array<byte> extra;
  if (pieces.size() > iovmax) {
    // Too many pieces, but we can't use multiple syscalls because they'd send separate
    // datagrams. We'll have to copy the trailing pieces into a temporary array.
    //
    // TODO(perf): On Linux we could use multiple syscalls via MSG_MORE or sendmsg/sendmmsg.
    size_t extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      extraSize += pieces[i].size();
    }
    extra = kj::heapArray<byte>(extraSize);
    extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      memcpy(extra.begin() + extraSize, pieces[i].begin(), pieces[i].size());
      extraSize += pieces[i].size();
    }
    iov.back().iov_base = extra.begin();
    iov.back().iov_len = extra.size();
  }

  msg.msg_iov = iov.begin();
  msg.msg_iovlen = iov.size();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendmsg(fd, &msg, 0));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, pieces, &destination]() {
      return send(pieces, destination);
    });
  } else {
    // If less than the whole message was sent, then it was truncated, and there's nothing we can
    // do about that now.
    return n;
  }
}